

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTimestamp.cxx
# Opt level: O2

string * __thiscall
cmTimestamp::FileModificationTime
          (string *__return_storage_ptr__,cmTimestamp *this,char *path,string *formatString,
          bool utcFlag)

{
  bool bVar1;
  int iVar2;
  uint32_t microseconds;
  time_t timeT;
  string real_path;
  uv_fs_t req;
  allocator<char> local_229;
  string local_228;
  string local_208;
  uv_fs_t local_1e8;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e8,path,&local_229);
  cmSystemTools::GetRealPathResolvingWindowsSubst(&local_228,(string *)&local_1e8,(string *)0x0);
  std::__cxx11::string::~string((string *)&local_1e8);
  bVar1 = cmsys::SystemTools::FileExists(&local_228);
  if (bVar1) {
    microseconds = 0;
    iVar2 = uv_fs_stat((uv_loop_t *)0x0,&local_1e8,local_228._M_dataplus._M_p,(uv_fs_cb)0x0);
    if (iVar2 == 0) {
      microseconds = (uint32_t)(local_1e8.statbuf.st_mtim.tv_nsec / 1000);
      timeT = local_1e8.statbuf.st_mtim.tv_sec;
    }
    else {
      timeT = 0;
    }
    uv_fs_req_cleanup(&local_1e8);
    std::__cxx11::string::string((string *)&local_208,(string *)formatString);
    CreateTimestampFromTimeT(__return_storage_ptr__,this,timeT,microseconds,&local_208,utcFlag);
    std::__cxx11::string::~string((string *)&local_208);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  std::__cxx11::string::~string((string *)&local_228);
  return __return_storage_ptr__;
}

Assistant:

std::string cmTimestamp::FileModificationTime(const char* path,
                                              const std::string& formatString,
                                              bool utcFlag) const
{
  std::string real_path =
    cmSystemTools::GetRealPathResolvingWindowsSubst(path);

  if (!cmsys::SystemTools::FileExists(real_path)) {
    return std::string();
  }

  // use libuv's implementation of stat(2) to get the file information
  time_t mtime = 0;
  uint32_t microseconds = 0;
  uv_fs_t req;
  if (uv_fs_stat(nullptr, &req, real_path.c_str(), nullptr) == 0) {
    mtime = static_cast<time_t>(req.statbuf.st_mtim.tv_sec);
    // tv_nsec has nanosecond resolution, but we truncate it to microsecond
    // resolution in order to be consistent with cmTimestamp::CurrentTime()
    microseconds = static_cast<uint32_t>(req.statbuf.st_mtim.tv_nsec / 1000);
  }
  uv_fs_req_cleanup(&req);

  return this->CreateTimestampFromTimeT(mtime, microseconds, formatString,
                                        utcFlag);
}